

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O3

char * duckdb_table_description_error(duckdb_table_description table)

{
  if ((table != (duckdb_table_description)0x0) && (*(long *)(table + 0x10) != 0)) {
    return *(char **)(table + 8);
  }
  return (char *)0x0;
}

Assistant:

const char *duckdb_table_description_error(duckdb_table_description table) {
	if (!table) {
		return nullptr;
	}
	auto wrapper = reinterpret_cast<TableDescriptionWrapper *>(table);
	if (wrapper->error.empty()) {
		return nullptr;
	}
	return wrapper->error.c_str();
}